

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O3

void DestroyMessageData(IOTHUB_MESSAGE_HANDLE_DATA *handleData)

{
  if (handleData->contentType == IOTHUBMESSAGE_STRING) {
    STRING_delete((handleData->value).string);
  }
  else if (handleData->contentType == IOTHUBMESSAGE_BYTEARRAY) {
    BUFFER_delete((handleData->value).byteArray);
  }
  Map_Destroy(handleData->properties);
  free(handleData->messageId);
  handleData->messageId = (char *)0x0;
  free(handleData->correlationId);
  handleData->correlationId = (char *)0x0;
  free(handleData->userDefinedContentType);
  free(handleData->contentEncoding);
  DestroyDiagnosticPropertyData(handleData->diagnosticData);
  free(handleData->outputName);
  free(handleData->inputName);
  free(handleData->connectionModuleId);
  free(handleData->connectionDeviceId);
  free(handleData->creationTimeUtc);
  free(handleData->userId);
  if ((handleData->dispositionContext != (MESSAGE_DISPOSITION_CONTEXT_HANDLE)0x0) &&
     (handleData->dispositionContextDestroyFunction !=
      (MESSAGE_DISPOSITION_CONTEXT_DESTROY_FUNCTION)0x0)) {
    (*handleData->dispositionContextDestroyFunction)(handleData->dispositionContext);
  }
  free(handleData->componentName);
  free(handleData);
  return;
}

Assistant:

static void DestroyMessageData(IOTHUB_MESSAGE_HANDLE_DATA* handleData)
{
    if (handleData->contentType == IOTHUBMESSAGE_BYTEARRAY)
    {
        BUFFER_delete(handleData->value.byteArray);
    }
    else if (handleData->contentType == IOTHUBMESSAGE_STRING)
    {
        STRING_delete(handleData->value.string);
    }

    Map_Destroy(handleData->properties);
    free(handleData->messageId);
    handleData->messageId = NULL;
    free(handleData->correlationId);
    handleData->correlationId = NULL;
    free(handleData->userDefinedContentType);
    free(handleData->contentEncoding);
    DestroyDiagnosticPropertyData(handleData->diagnosticData);
    free(handleData->outputName);
    free(handleData->inputName);
    free(handleData->connectionModuleId);
    free(handleData->connectionDeviceId);
    free(handleData->creationTimeUtc);
    free(handleData->userId);

    if (handleData->dispositionContext != NULL && handleData->dispositionContextDestroyFunction != NULL)
    {
        handleData->dispositionContextDestroyFunction(handleData->dispositionContext);
    }

    free(handleData->componentName);
    free(handleData);
}